

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Execute<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state,string_t x_data,
               hugeint_t y_data,AggregateBinaryInput *binary)

{
  long lVar1;
  bool bVar2;
  hugeint_t local_28;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_28.upper = y_data.upper;
  local_28.lower = y_data.lower;
  local_18.pointer.ptr = (char *)x_data.value._8_8_;
  local_18._0_8_ = x_data.value._0_8_;
  lVar1 = (state->value).upper;
  if ((local_28.upper < lVar1) || (local_28.lower < (state->value).lower && lVar1 == local_28.upper)
     ) {
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    Assign<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
              (state,(string_t *)&local_18.pointer,&local_28,!bVar2);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}